

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
rehash(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
       *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Node *pNVar3;
  TypedFunctionInstanceRequest local_48;
  Node *local_30;
  Node *item;
  Node *pNStack_20;
  uint i;
  Node *oldData;
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
  *pSStack_10;
  uint oldBucketCount;
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
  *this_local;
  
  oldData._4_4_ = this->bucketCount;
  pNStack_20 = this->data;
  this->bucketCount = this->bucketCount << 1;
  pSStack_10 = this;
  if (this->allocator == (Allocator *)0x0) {
    pNVar3 = (Node *)(*(code *)NULLC::alloc)(((ulong)this->bucketCount & 0x7ffffff) << 5);
    this->data = pNVar3;
  }
  else {
    iVar2 = (*this->allocator->_vptr_Allocator[2])();
    this->data = (Node *)CONCAT44(extraout_var,iVar2);
  }
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 5);
  this->count = 0;
  for (item._4_4_ = 0; item._4_4_ < oldData._4_4_; item._4_4_ = item._4_4_ + 1) {
    pNVar3 = pNStack_20 + item._4_4_;
    local_30 = pNVar3;
    TypedFunctionInstanceRequest::TypedFunctionInstanceRequest(&local_48);
    bVar1 = TypedFunctionInstanceRequest::operator==(&pNVar3->key,&local_48);
    if (!bVar1) {
      insert(this,&local_30->key,&local_30->value);
    }
  }
  if (pNStack_20 != this->storage) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pNStack_20);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,pNStack_20);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		else
			data = (Node*)NULLC::alloc(sizeof(Node) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node &item = oldData[i];

			if(item.key == Key())
				continue;

			insert(item.key, item.value);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}